

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall CGraphics_Threaded::ScreenshotDirect(CGraphics_Threaded *this,char *pFilename)

{
  CCommandBuffer *pCVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  char *format;
  long in_FS_OFFSET;
  png_t Png;
  CImageInfo Image;
  char aBuf [544];
  char aWholePath [512];
  png_t local_4c8;
  CScreenshotCommand local_488;
  CImageInfo local_460;
  char local_448 [544];
  char local_228 [520];
  long local_20;
  IOHANDLE io;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(&local_460,0x18);
  local_488.super_CCommand.m_Cmd = 10;
  local_488.super_CCommand.m_pNext = (CCommand *)0x0;
  local_488.m_X = 0;
  local_488.m_Y = 0;
  local_488.m_W = -1;
  local_488.m_H = -1;
  local_488.m_pImage = &local_460;
  CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>(this->m_pCommandBuffer,&local_488);
  (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])(this->m_pBackend,this->m_pCommandBuffer);
  uVar3 = (ulong)this->m_CurrentCommandBuffer ^ 1;
  this->m_CurrentCommandBuffer = (uint)uVar3;
  pCVar1 = this->m_apCommandBuffers[uVar3];
  this->m_pCommandBuffer = pCVar1;
  (pCVar1->m_CmdBuffer).m_Used = 0;
  *(undefined8 *)&(pCVar1->m_DataBuffer).m_Used = 0;
  *(undefined8 *)((long)&pCVar1->m_pCmdBufferHead + 4) = 0;
  *(undefined4 *)((long)&pCVar1->m_pCmdBufferTail + 4) = 0;
  (**(code **)(*(long *)this + 0x150))(this);
  if ((uchar *)local_460.m_pData != (uchar *)0x0) {
    iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                      (this->m_pStorage,pFilename,2,0,local_228,0x200,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
    if (io == (IOHANDLE)0x0) {
      format = "failed to open file \'%s\'";
    }
    else {
      png_open_write(&local_4c8,(png_write_callback_t)0x0,io);
      png_set_data(&local_4c8,local_460.m_Width,local_460.m_Height,'\b',2,(uchar *)local_460.m_pData
                  );
      io_close(io);
      format = "saved screenshot to \'%s\'";
      pFilename = local_228;
    }
    str_format(local_448,0x220,format,pFilename);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client/screenshot",local_448,0);
    mem_free(local_460.m_pData);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::ScreenshotDirect(const char *pFilename)
{
	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = 0; Cmd.m_Y = 0;
	Cmd.m_W = -1; Cmd.m_H = -1;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	if(Image.m_pData)
	{
		// find filename
		char aWholePath[IO_MAX_PATH_LENGTH];
		char aBuf[IO_MAX_PATH_LENGTH+32];
		IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE, aWholePath, sizeof(aWholePath));
		if(File)
		{
			// save png
			png_t Png; // ignore_convention
			png_open_write(&Png, 0, File); // ignore_convention
			png_set_data(&Png, Image.m_Width, Image.m_Height, 8, PNG_TRUECOLOR, (unsigned char *)Image.m_pData); // ignore_convention
			io_close(File);
			str_format(aBuf, sizeof(aBuf), "saved screenshot to '%s'", aWholePath);
		}
		else
		{
			str_format(aBuf, sizeof(aBuf), "failed to open file '%s'", pFilename);
		}
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/screenshot", aBuf);
		mem_free(Image.m_pData);
	}
}